

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      end,anon_class_8_1_8991fb9c comp)

{
  pair<int,_int> *ppVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  pointer piVar11;
  pointer piVar12;
  pair<int,_int> pVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var18;
  long lVar19;
  long lVar20;
  pair<int,_int> *ppVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  pair<int,_int> *ppVar25;
  bool local_79;
  int local_60;
  
  if (begin._M_current == end._M_current) {
    local_79 = true;
  }
  else {
    lVar20 = 0;
    uVar17 = 0;
    _Var18._M_current = begin._M_current;
    do {
      ppVar1 = _Var18._M_current + 1;
      local_79 = ppVar1 == end._M_current;
      if (local_79) {
        return local_79;
      }
      uVar2 = _Var18._M_current[1].first;
      piVar11 = ((comp.this)->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar12 = ((comp.this)->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar3 = _Var18._M_current[1].second;
      iVar16 = piVar12[(int)uVar3];
      iVar4 = piVar11[(int)uVar2];
      iVar9 = iVar4;
      if (iVar16 < iVar4) {
        iVar9 = iVar16;
      }
      uVar5 = (_Var18._M_current)->first;
      uVar6 = (_Var18._M_current)->second;
      iVar7 = piVar12[(int)uVar6];
      iVar8 = piVar11[(int)uVar5];
      iVar10 = iVar8;
      if (iVar7 < iVar8) {
        iVar10 = iVar7;
      }
      if ((iVar9 == 2) && (iVar10 != 2)) {
LAB_0032596e:
        pVar13 = _Var18._M_current[1];
        _Var18._M_current[1] = *_Var18._M_current;
        local_60 = pVar13.second;
        iVar16 = pVar13.first;
        ppVar21 = ppVar1;
        if (_Var18._M_current != begin._M_current) {
          uVar22 = (((ulong)pVar13 >> 0x20) + 0x80c8963be3e4c2f3) *
                   (((ulong)pVar13 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                   (((ulong)pVar13 >> 0x20) + 0x8a183895eeac1536) *
                   (((ulong)pVar13 & 0xffffffff) + 0x42d8680e260ae5b);
          lVar24 = lVar20;
          do {
            ppVar25 = _Var18._M_current;
            iVar4 = piVar12[(long)pVar13 >> 0x20];
            iVar9 = piVar11[iVar16];
            iVar7 = iVar9;
            if (iVar4 < iVar9) {
              iVar7 = iVar4;
            }
            uVar2 = ppVar25[-1].first;
            uVar3 = ppVar25[-1].second;
            iVar8 = piVar12[(int)uVar3];
            iVar10 = piVar11[(int)uVar2];
            iVar14 = iVar10;
            if (iVar8 < iVar10) {
              iVar14 = iVar8;
            }
            if ((iVar7 != 2) || (iVar14 == 2)) {
              _Var18._M_current = ppVar25;
              if ((iVar7 != 2) && (iVar14 == 2)) {
                ppVar21 = ppVar25 + 1;
                break;
              }
              lVar15 = (long)iVar9 * (long)iVar4;
              lVar19 = (long)iVar10 * (long)iVar8;
              if ((lVar19 <= lVar15) &&
                 ((lVar15 - lVar19 != 0 && lVar19 <= lVar15 ||
                  ((iVar14 <= iVar7 &&
                   ((iVar14 < iVar7 ||
                    ((uVar23 = ((ulong)uVar3 + 0x80c8963be3e4c2f3) *
                               ((ulong)uVar2 + 0xc8497d2a400d9551) >> 0x20 ^
                               ((ulong)uVar3 + 0x8a183895eeac1536) *
                               ((ulong)uVar2 + 0x42d8680e260ae5b), uVar23 <= uVar22 &&
                     ((uVar23 < uVar22 ||
                      (((int)uVar2 <= iVar16 && (((int)uVar2 < iVar16 || ((int)uVar3 <= local_60))))
                      )))))))))))) break;
            }
            _Var18._M_current = ppVar25 + -1;
            *ppVar25 = ppVar25[-1];
            lVar24 = lVar24 + 8;
            ppVar21 = ppVar25;
          } while (lVar24 != 0);
        }
        (_Var18._M_current)->first = iVar16;
        ppVar21[-1].second = local_60;
        uVar17 = uVar17 + ((long)ppVar1 - (long)_Var18._M_current >> 3);
      }
      else if ((iVar9 == 2) || (iVar10 != 2)) {
        lVar24 = (long)iVar4 * (long)iVar16;
        lVar15 = (long)iVar8 * (long)iVar7;
        if (lVar24 < lVar15) goto LAB_0032596e;
        if (lVar24 - lVar15 == 0 || lVar24 < lVar15) {
          if (iVar9 < iVar10) goto LAB_0032596e;
          if (iVar9 <= iVar10) {
            uVar22 = ((ulong)uVar3 + 0x80c8963be3e4c2f3) * ((ulong)uVar2 + 0xc8497d2a400d9551) >>
                     0x20 ^ ((ulong)uVar3 + 0x8a183895eeac1536) * ((ulong)uVar2 + 0x42d8680e260ae5b)
            ;
            uVar23 = ((ulong)uVar6 + 0x80c8963be3e4c2f3) * ((ulong)uVar5 + 0xc8497d2a400d9551) >>
                     0x20 ^ ((ulong)uVar6 + 0x8a183895eeac1536) * ((ulong)uVar5 + 0x42d8680e260ae5b)
            ;
            if ((uVar22 < uVar23) ||
               ((uVar22 <= uVar23 &&
                (((int)uVar2 < (int)uVar5 || ((int)uVar3 < (int)uVar6 && (int)uVar2 <= (int)uVar5)))
                ))) goto LAB_0032596e;
          }
        }
      }
      lVar20 = lVar20 + -8;
      _Var18._M_current = ppVar1;
    } while (uVar17 < 9);
  }
  return local_79;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }